

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O3

double icu_63::double_conversion::RadixStringToIeee<4,char_const*>
                 (char **current,char *end,bool sign,bool allow_trailing_junk,
                 double junk_string_value,bool read_as_double,bool *result_is_junk)

{
  char cVar1;
  byte bVar2;
  sbyte sVar3;
  double dVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  byte *pbVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  DiyFp diy_fp;
  
  *result_is_junk = true;
  pcVar9 = *current;
  while (*pcVar9 == '0') {
    pcVar9 = pcVar9 + 1;
    *current = pcVar9;
    if (pcVar9 == end) {
      *result_is_junk = false;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  sVar3 = 0x18;
  if (read_as_double) {
    sVar3 = 0x35;
  }
  lVar13 = 0;
  while( true ) {
    cVar1 = *pcVar9;
    lVar7 = (long)(int)cVar1;
    if ((int)cVar1 - 0x30U < 10) {
      lVar7 = lVar7 + -0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 6) {
      lVar7 = lVar7 + -0x57;
    }
    else {
      if (5 < (byte)(cVar1 + 0xbfU)) {
        if (pcVar9 != end && !allow_trailing_junk) {
          do {
            lVar7 = 0;
            while ((&kWhitespaceTable7)[lVar7] != *pcVar9) {
              lVar7 = lVar7 + 1;
              if (lVar7 == 6) {
                return junk_string_value;
              }
            }
            pcVar9 = pcVar9 + 1;
            *current = pcVar9;
          } while (pcVar9 != end);
        }
        goto LAB_002db0d9;
      }
      lVar7 = lVar7 + -0x37;
    }
    lVar13 = lVar13 * 0x10 + lVar7;
    uVar14 = lVar13 >> sVar3;
    if ((int)uVar14 != 0) break;
    pcVar9 = pcVar9 + 1;
    *current = pcVar9;
    if (pcVar9 == end) {
LAB_002db0d9:
      *result_is_junk = false;
      if (sign) {
        if (lVar13 == 0) {
          return -0.0;
        }
        lVar13 = -lVar13;
      }
      return (double)lVar13;
    }
  }
  iVar6 = 1;
  if (1 < (int)uVar14) {
    uVar8 = uVar14 & 0xffffffff;
    do {
      iVar6 = iVar6 + 1;
      uVar8 = uVar8 >> 1;
      uVar15 = (uint)uVar14;
      uVar14 = uVar8;
    } while (3 < uVar15);
  }
  bVar5 = (byte)iVar6;
  uVar14 = lVar13 >> (bVar5 & 0x3f);
  pbVar10 = (byte *)(pcVar9 + 1);
  *current = (char *)pbVar10;
  if (pbVar10 == (byte *)end) {
    bVar11 = 1;
  }
  else {
    bVar11 = 1;
    do {
      bVar2 = *pbVar10;
      if ((0x3f < (char)bVar2 || 9 < (int)(char)bVar2 - 0x30U) &&
         ((uVar15 = bVar2 - 0x41, 0x25 < uVar15 ||
          ((0x3f0000003fU >> ((ulong)uVar15 & 0x3f) & 1) == 0)))) {
        if (!allow_trailing_junk) {
          do {
            lVar7 = 0;
            while ((&kWhitespaceTable7)[lVar7] != *pbVar10) {
              lVar7 = lVar7 + 1;
              if (lVar7 == 6) {
                return junk_string_value;
              }
            }
            pbVar10 = pbVar10 + 1;
            *current = (char *)pbVar10;
          } while (pbVar10 != (byte *)end);
        }
        break;
      }
      bVar11 = bVar11 & bVar2 == 0x30;
      iVar6 = iVar6 + 4;
      pbVar10 = pbVar10 + 1;
      *current = (char *)pbVar10;
    } while (pbVar10 != (byte *)end);
  }
  uVar12 = (uint)lVar13 & ~(-1 << (bVar5 & 0x1f));
  uVar15 = 1 << (bVar5 - 1 & 0x1f);
  if ((int)uVar15 < (int)uVar12) {
    uVar14 = uVar14 + 1;
  }
  else if (uVar12 == uVar15) {
    uVar14 = uVar14 + ((byte)(~bVar11 | (byte)uVar14) & 1);
  }
  bVar16 = (uVar14 >> sVar3 & 1) != 0;
  diy_fp._8_8_ = (Double *)((long)uVar14 >> bVar16);
  *result_is_junk = false;
  diy_fp.f_ = (ulong)(iVar6 + (uint)bVar16);
  dVar4 = (double)Double::DiyFpToUint64(diy_fp._8_8_,diy_fp);
  return dVar4;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  ASSERT(*current != end);

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  // Skip leading 0s.
  while (**current == '0') {
    ++(*current);
    if (*current == end) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);

  do {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent = overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        ++(*current);
        if (*current == end || !isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        exponent += radix_log_2;
      }

      if (!allow_trailing_junk && AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    ++(*current);
  } while (*current != end);

  ASSERT(number < ((int64_t)1 << kSignificandSize));
  ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (exponent == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  ASSERT(number != 0);
  return Double(DiyFp(number, exponent)).value();
}